

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_exit(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int local_2c;
  sxi32 iExitStatus;
  int iLen;
  char *zData;
  jx9_value **apArg_local;
  jx9_context *pjStack_10;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (0 < nArg) {
    zData = (char *)apArg;
    apArg_local._4_4_ = nArg;
    pjStack_10 = pCtx;
    iVar1 = jx9_value_is_string(*apArg);
    if (iVar1 == 0) {
      iVar1 = jx9_value_is_int(*(jx9_value **)zData);
      if (iVar1 != 0) {
        iVar1 = jx9_value_to_int(*(jx9_value **)zData);
        pjStack_10->pVm->iExitStatus = iVar1;
      }
    }
    else {
      local_2c = 0;
      _iExitStatus = jx9_value_to_string(*(jx9_value **)zData,&local_2c);
      jx9_context_output(pjStack_10,_iExitStatus,local_2c);
    }
  }
  return -10;
}

Assistant:

static int vm_builtin_exit(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	if( nArg > 0 ){
		if( jx9_value_is_string(apArg[0]) ){
			const char *zData;
			int iLen = 0;
			/* Print exit message */
			zData = jx9_value_to_string(apArg[0], &iLen);
			jx9_context_output(pCtx, zData, iLen);
		}else if(jx9_value_is_int(apArg[0]) ){
			sxi32 iExitStatus;
			/* Record exit status code */
			iExitStatus = jx9_value_to_int(apArg[0]);
			pCtx->pVm->iExitStatus = iExitStatus;
		}
	}
	/* Abort processing immediately */
	return JX9_ABORT;
}